

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
bas::Vector<float2,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
          (Vector<float2,4ul,bas::RawAllocator> *this,Vector<float2,_4UL,_bas::RawAllocator> *other)

{
  float2 *pfVar1;
  float2 *__cur;
  size_t sVar2;
  float2 *pfVar3;
  size_t sVar4;
  float2 *pfVar5;
  
  sVar2 = Vector<float2,_4UL,_bas::RawAllocator>::size(other);
  if (sVar2 < 5) {
    pfVar3 = (float2 *)(this + 0x1c);
    sVar4 = 4;
  }
  else {
    pfVar3 = (float2 *)aligned_malloc(sVar2 * 8,4);
    sVar4 = sVar2;
  }
  *(float2 **)this = pfVar3;
  *(float2 **)(this + 8) = pfVar3 + sVar2;
  *(float2 **)(this + 0x10) = pfVar3 + sVar4;
  pfVar1 = other->m_end;
  for (pfVar5 = other->m_begin; pfVar5 != pfVar1; pfVar5 = pfVar5 + 1) {
    *pfVar3 = *pfVar5;
    pfVar3 = pfVar3 + 1;
  }
  *(long *)(this + 0x40) = *(long *)(this + 8) - *(long *)this >> 3;
  return;
}

Assistant:

void init_copy_from_other_vector(const Vector<T, OtherN, Allocator> &other)
    {
        m_allocator = other.m_allocator;

        size_t size = other.size();
        size_t capacity = size;

        if (size <= N) {
            m_begin = this->small_buffer();
            capacity = N;
        }
        else {
            m_begin = (T *)m_allocator.allocate(sizeof(T) * size,
                                                std::alignment_of<T>::value);
            capacity = size;
        }

        m_end = m_begin + size;
        m_capacity_end = m_begin + capacity;

        uninitialized_copy(other.begin(), other.end(), m_begin);
        UPDATE_VECTOR_SIZE(this);
    }